

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_psllq_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint64_t uVar1;
  
  if (s->_q_MMXReg[0] < 0x40) {
    uVar1 = d->_q_MMXReg[0] << (s->_b_MMXReg[0] & 0x3f);
  }
  else {
    uVar1 = 0;
  }
  d->_q_MMXReg[0] = uVar1;
  return;
}

Assistant:

void glue(helper_psllq, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    int shift;

    if (s->Q(0) > 63) {
        d->Q(0) = 0;
#if SHIFT == 1
        d->Q(1) = 0;
#endif
    } else {
        shift = s->B(0);
        d->Q(0) <<= shift;
#if SHIFT == 1
        d->Q(1) <<= shift;
#endif
    }
}